

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetJoin.cpp
# Opt level: O0

void __thiscall
SetJoinPlugin::OnJoin(SetJoinPlugin *this,Client *server,string_view chan,string_view nick)

{
  char *pcVar1;
  SetJoinPlugin *pSVar2;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  undefined8 uVar6;
  basic_string_view<char,_std::char_traits<char>_> *args_3;
  undefined1 auVar7 [16];
  __sv_type _Var8;
  size_t local_f8;
  char *local_f0;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  undefined1 local_b8 [8];
  string join_message;
  char *local_90;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  SetJoinPlugin *local_68;
  size_t local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [8];
  string_view setjoin;
  Client *server_local;
  SetJoinPlugin *this_local;
  string_view nick_local;
  string_view chan_local;
  
  args_3 = (basic_string_view<char,_std::char_traits<char>_> *)nick._M_str;
  this_local = (SetJoinPlugin *)nick._M_len;
  nick_local._M_str = (char *)chan._M_len;
  setjoin._M_str = (char *)server;
  nick_local._M_len = (size_t)args_3;
  local_58 = Jupiter::IRC::Client::getConfigSection();
  uVar6 = Jupiter::Config::operator[](&this->field_0x38,local_58._0_8_,local_58._8_8_);
  local_68 = this_local;
  local_60 = nick_local._M_len;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78);
  auVar7 = Jupiter::Config::get(uVar6,local_68,local_60,local_78._M_len,local_78._M_str);
  setjoin._M_len = auVar7._8_8_;
  local_48 = auVar7._0_8_;
  bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_48);
  sVar3 = nick_local._M_len;
  pSVar2 = this_local;
  pcVar1 = setjoin._M_str;
  if (bVar5) {
    join_0x00000010_0x00000000_ =
         sv("No setjoin has been set for you. To set one, use the !setjoin command",0x45);
    Jupiter::IRC::Client::sendNotice(pcVar1,pSVar2,sVar3,join_message.field_2._8_8_,local_90);
  }
  else {
    local_c8 = sv("\x02\x0307[",5);
    local_d8 = sv("]\x03\x02: ",5);
    jessilib::
    join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
               (jessilib *)&local_c8,(basic_string_view<char,_std::char_traits<char>_> *)&this_local
               ,&local_d8,(basic_string_view<char,_std::char_traits<char>_> *)local_48,args_3);
    pcVar4 = nick_local._M_str;
    pcVar1 = setjoin._M_str;
    _Var8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_b8);
    local_f8 = _Var8._M_len;
    local_f0 = _Var8._M_str;
    Jupiter::IRC::Client::sendMessage(pcVar1,pcVar4,chan._M_str,local_f8,local_f0);
    std::__cxx11::string::~string((string *)local_b8);
  }
  return;
}

Assistant:

void SetJoinPlugin::OnJoin(Jupiter::IRC::Client *server, std::string_view chan, std::string_view nick) {
	std::string_view setjoin = this->config[server->getConfigSection()].get(nick);
	if (setjoin.empty()) {
		server->sendNotice(nick, "No setjoin has been set for you. To set one, use the !setjoin command"sv);
		return;
	}

	std::string join_message = jessilib::join<std::string>(IRCBOLD IRCCOLOR "07["sv, nick, "]" IRCCOLOR IRCBOLD ": "sv, setjoin);
	server->sendMessage(chan, join_message);
}